

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

CharCount __thiscall
UnifiedRegex::AltNode::TransferPass0(AltNode *this,Compiler *compiler,Char *litbuf)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 rhs;
  uint32 lhs;
  undefined4 *puVar4;
  AltNode *curr;
  AltNode *pAVar5;
  AltNode *pAVar6;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (this->tail == (AltNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x855,"(tail != 0)","tail != 0");
    if (!bVar2) {
LAB_00d1286e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  lhs = 0;
  pAVar6 = (AltNode *)0x0;
  do {
    pAVar5 = this;
    if (pAVar5 == (AltNode *)0x0) {
      return lhs;
    }
    if (pAVar5->head->tag == Alt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x85c,"(curr->head->tag != Alt)","curr->head->tag != Alt");
      if (!bVar2) goto LAB_00d1286e;
      *puVar4 = 0;
    }
    if (pAVar6 != (AltNode *)0x0) {
      iVar3 = (*pAVar6->head->_vptr_Node[2])();
      if ((char)iVar3 != '\0') {
        iVar3 = (*pAVar5->head->_vptr_Node[2])();
        if ((char)iVar3 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                             ,0x85d,
                             "(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()))"
                             ,
                             "prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet())"
                            );
          if (!bVar2) goto LAB_00d1286e;
          *puVar4 = 0;
        }
      }
    }
    rhs = (*pAVar5->head->_vptr_Node[3])(pAVar5->head,compiler,litbuf);
    lhs = UInt32Math::Add(lhs,rhs);
    this = pAVar5->tail;
    pAVar6 = pAVar5;
  } while( true );
}

Assistant:

CharCount AltNode::TransferPass0(Compiler& compiler, const Char* litbuf)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(tail != 0);
        CharCount n = 0;
#if DBG
        AltNode* prev = 0;
#endif
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            Assert(curr->head->tag != Alt);
            Assert(prev == 0 || !(prev->head->IsCharOrPositiveSet() && curr->head->IsCharOrPositiveSet()));
            n = UInt32Math::Add(n, curr->head->TransferPass0(compiler, litbuf));
#if DBG
            prev = curr;
#endif
        }
        return n;
    }